

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O1

void Kit_SopDivideByCube(Kit_Sop_t *cSop,Kit_Sop_t *cDiv,Kit_Sop_t *vQuo,Kit_Sop_t *vRem,
                        Vec_Int_t *vMemory)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  long lVar6;
  uint *puVar7;
  int *piVar8;
  
  if (cDiv->nCubes != 1) {
    __assert_fail("Kit_SopCubeNum(cDiv) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitSop.c"
                  ,0x96,
                  "void Kit_SopDivideByCube(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  uVar1 = *cDiv->pCubes;
  vQuo->nCubes = 0;
  uVar3 = cSop->nCubes;
  if ((ulong)uVar3 == 0) {
LAB_005d8994:
    puVar5 = (uint *)0x0;
  }
  else {
    if ((int)uVar3 < 1) goto LAB_005d8a50;
    lVar6 = (long)(int)uVar3 + (long)vMemory->nSize;
    iVar4 = (int)lVar6;
    vMemory->nSize = iVar4;
    if (vMemory->nCap < iVar4) goto LAB_005d8994;
    puVar5 = (uint *)(vMemory->pArray + (lVar6 - (ulong)uVar3));
  }
  vQuo->pCubes = puVar5;
  vRem->nCubes = 0;
  uVar3 = cSop->nCubes;
  if ((ulong)uVar3 != 0) {
    if ((int)uVar3 < 1) {
LAB_005d8a50:
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar6 = (long)(int)uVar3 + (long)vMemory->nSize;
    iVar4 = (int)lVar6;
    vMemory->nSize = iVar4;
    if (iVar4 <= vMemory->nCap) {
      puVar5 = (uint *)(vMemory->pArray + (lVar6 - (ulong)uVar3));
      goto LAB_005d89eb;
    }
  }
  puVar5 = (uint *)0x0;
LAB_005d89eb:
  vRem->pCubes = puVar5;
  if (0 < cSop->nCubes) {
    puVar2 = cSop->pCubes;
    lVar6 = 0;
    do {
      uVar3 = puVar2[lVar6];
      if (uVar3 == 0) {
        return;
      }
      puVar7 = puVar5;
      piVar8 = &vRem->nCubes;
      if ((uVar1 & ~uVar3) == 0) {
        uVar3 = uVar3 & ~uVar1;
        puVar7 = vQuo->pCubes;
        piVar8 = &vQuo->nCubes;
      }
      iVar4 = *piVar8;
      *piVar8 = iVar4 + 1;
      puVar7[iVar4] = uVar3;
      lVar6 = lVar6 + 1;
    } while (lVar6 < cSop->nCubes);
  }
  return;
}

Assistant:

void Kit_SopDivideByCube( Kit_Sop_t * cSop, Kit_Sop_t * cDiv, Kit_Sop_t * vQuo, Kit_Sop_t * vRem, Vec_Int_t * vMemory )
{
    unsigned uCube, uDiv;
    int i;
    // get the only cube
    assert( Kit_SopCubeNum(cDiv) == 1 );
    uDiv = Kit_SopCube(cDiv, 0);
    // allocate covers
    vQuo->nCubes = 0;
    vQuo->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) );
    vRem->nCubes = 0;
    vRem->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) );
    // sort the cubes
    Kit_SopForEachCube( cSop, uCube, i )
    {
        if ( Kit_CubeContains( uCube, uDiv ) )
            Kit_SopPushCube( vQuo, Kit_CubeSharp(uCube, uDiv) );
        else
            Kit_SopPushCube( vRem, uCube );
    }
}